

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::setCompleter(QLineEdit *this,QCompleter *c)

{
  QLineEditPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  QWidget *pQVar3;
  QObject *pQVar4;
  QWidgetLineControl *this_01;
  
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  this_01 = this_00->control;
  pDVar1 = (this_01->m_completer).wp.d;
  if (pDVar1 == (Data *)0x0) {
    if (c == (QCompleter *)0x0) {
      return;
    }
    QWidgetLineControl::setCompleter((QWidgetLineControl *)this_01,c);
  }
  else {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this_01->m_completer).wp.value;
    }
    if (pQVar4 == &c->super_QObject) {
      return;
    }
    if ((*(int *)(pDVar1 + 4) != 0) && ((this_01->m_completer).wp.value != (QObject *)0x0)) {
      QLineEditPrivate::disconnectCompleter(this_00);
      QCompleter::setWidget((QCompleter *)(this_00->control->m_completer).wp.value,(QWidget *)0x0);
      this_01 = this_00->control;
      pDVar1 = (this_01->m_completer).wp.d;
      if ((pDVar1 != (Data *)0x0) &&
         ((pQVar4 = (this_01->m_completer).wp.value,
          *(QLineEdit **)(*(long *)(pQVar4 + 8) + 0x10) == this && (*(int *)(pDVar1 + 4) != 0)))) {
        (**(code **)(*(long *)pQVar4 + 0x20))(pQVar4);
        this_01 = this_00->control;
      }
    }
    QWidgetLineControl::setCompleter((QWidgetLineControl *)this_01,c);
    if (c == (QCompleter *)0x0) {
      return;
    }
  }
  pQVar3 = QCompleter::widget(c);
  if (pQVar3 == (QWidget *)0x0) {
    QCompleter::setWidget(c,&this->super_QWidget);
  }
  bVar2 = QWidget::hasFocus(&this->super_QWidget);
  if (!bVar2) {
    return;
  }
  QLineEditPrivate::connectCompleter(this_00);
  return;
}

Assistant:

void QLineEdit::setCompleter(QCompleter *c)
{
    Q_D(QLineEdit);
    if (c == d->control->completer())
        return;
    if (d->control->completer()) {
        d->disconnectCompleter();
        d->control->completer()->setWidget(nullptr);
        if (d->control->completer()->parent() == this)
            delete d->control->completer();
    }
    d->control->setCompleter(c);
    if (!c)
        return;
    if (c->widget() == nullptr)
        c->setWidget(this);
    if (hasFocus())
        d->connectCompleter();
}